

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall
re2::Prog::EmitList(Prog *this,int root,SparseArray<int> *rootmap,
                   vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,SparseSet *q,
                   vector<int,_std::allocator<int>_> *stk)

{
  pointer *ppIVar1;
  uint uVar2;
  pointer piVar3;
  iterator iVar4;
  Inst *pIVar5;
  iterator iVar6;
  pointer pIVar7;
  pointer pIVar8;
  bool bVar9;
  uint uVar10;
  uint i;
  int iVar11;
  uint local_4c;
  vector<int,_std::allocator<int>_> *local_48;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_3c;
  Prog *local_38;
  
  q->size_ = 0;
  piVar3 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar3) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar3;
  }
  iVar4._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  local_4c = root;
  local_48 = stk;
  local_38 = this;
  if (iVar4._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)stk,iVar4,(int *)&local_4c);
  }
  else {
    *iVar4._M_current = root;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar4._M_current + 1;
  }
  do {
    piVar3 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start == piVar3) {
      return;
    }
    i = piVar3[-1];
    (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar3 + -1;
    do {
      bVar9 = SparseSet::contains(q,i);
      if (bVar9) break;
      SparseSet::insert_new(q,i);
      if (i != local_4c) {
        if ((int)i < 0) {
          __assert_fail("(i) >= (0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                        ,0x134,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
        }
        if (rootmap->max_size_ <= (int)i) goto LAB_001324d2;
        if (i < (uint)rootmap->max_size_) {
          if (((uint)rootmap->sparse_to_dense_[i] < (uint)rootmap->size_) &&
             ((rootmap->dense_).
              super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
              ._M_impl.super__Vector_impl_data._M_start[rootmap->sparse_to_dense_[i]].index_ == i))
          {
            iVar6._M_current =
                 (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                        (flat,iVar6);
            }
            else {
              (iVar6._M_current)->out_opcode_ = 0;
              (iVar6._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
              ppIVar1 = &(flat->
                         super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppIVar1 = *ppIVar1 + 1;
            }
            pIVar7 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            uVar10 = pIVar7[-1].out_opcode_;
            pIVar7[-1].out_opcode_ = uVar10 & 0xfffffff8 | 6;
            if (rootmap->max_size_ <= (int)i) goto LAB_001324d2;
            if ((((uint)rootmap->max_size_ <= i) ||
                (uVar2 = rootmap->sparse_to_dense_[i], (uint)rootmap->size_ <= uVar2)) ||
               (pIVar8 = (rootmap->dense_).
                         super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                         ._M_impl.super__Vector_impl_data._M_start, pIVar8[(int)uVar2].index_ != i))
            goto LAB_001324b3;
            pIVar7[-1].out_opcode_ = uVar10 & 8 | 6 | pIVar8[(int)uVar2].second << 4;
            break;
          }
        }
      }
      pIVar5 = local_38->inst_;
      switch(pIVar5[(int)i].out_opcode_ & 7) {
      case 1:
        iVar6._M_current =
             (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                    (flat,iVar6);
        }
        else {
          (iVar6._M_current)->out_opcode_ = 0;
          (iVar6._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
          ppIVar1 = &(flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        pIVar7 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar10 = (pIVar7[-1].out_opcode_ & 0xfffffff8) + 1;
        pIVar7[-1].out_opcode_ = uVar10;
        iVar11 = (int)((ulong)((long)pIVar7 -
                              (long)(flat->
                                    super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 3);
        pIVar7[-1].out_opcode_ = uVar10 & 9 | iVar11 << 4;
        pIVar7[-1].field_1.out1_ = iVar11 + 1;
      case 0:
        if ((pIVar5[(int)i].out_opcode_ & 6) != 0) {
          __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                        ,0x6d,"int re2::Prog::Inst::out1()");
        }
        local_3c = pIVar5[(int)i].field_1;
        iVar4._M_current =
             (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_48,iVar4,&local_3c.cap_);
        }
        else {
          *iVar4._M_current = (int)local_3c;
          (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar4._M_current + 1;
        }
        i = pIVar5[(int)i].out_opcode_ >> 4;
        bVar9 = true;
        break;
      default:
        iVar6._M_current =
             (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                    (flat,iVar6);
        }
        else {
          (iVar6._M_current)->out_opcode_ = 0;
          (iVar6._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
          ppIVar1 = &(flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1] = pIVar5[(int)i];
        uVar10 = pIVar5[(int)i].out_opcode_ >> 4;
        if (rootmap->max_size_ <= (int)uVar10) {
LAB_001324d2:
          __assert_fail("(i) < (max_size_)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                        ,0x135,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
        }
        if ((((uint)rootmap->max_size_ <= uVar10) ||
            (uVar2 = rootmap->sparse_to_dense_[uVar10], (uint)rootmap->size_ <= uVar2)) ||
           (pIVar8 = (rootmap->dense_).
                     super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                     ._M_impl.super__Vector_impl_data._M_start, pIVar8[(int)uVar2].index_ != uVar10)
           ) {
LAB_001324b3:
          __assert_fail("has_index(i)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                        ,0x18d,"Value re2::SparseArray<int>::get_existing(int) const [Value = int]")
          ;
        }
        pIVar7 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        pIVar7[-1].out_opcode_ = pIVar7[-1].out_opcode_ & 0xf | pIVar8[(int)uVar2].second << 4;
        goto LAB_001323b6;
      case 5:
      case 7:
        iVar6._M_current =
             (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                    (flat,iVar6);
        }
        else {
          (iVar6._M_current)->out_opcode_ = 0;
          (iVar6._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
          ppIVar1 = &(flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1] = pIVar5[(int)i];
LAB_001323b6:
        bVar9 = false;
        break;
      case 6:
        i = pIVar5[(int)i].out_opcode_ >> 4;
        bVar9 = true;
      }
    } while (bVar9);
  } while( true );
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap, vector<Inst>* flat,
                    SparseSet* q, vector<int>* stk) {
  q->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (q->contains(id))
      continue;
    q->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32>(flat->size())+1;
        // Fall through.

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}